

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void jsondec_checkempty(jsondec *d,upb_StringView str,upb_FieldDef *f)

{
  upb_Status *status;
  char *pcVar1;
  
  if (str.data != (char *)0x0) {
    return;
  }
  d->result = 2;
  status = d->status;
  pcVar1 = upb_FieldDef_FullName((upb_FieldDef *)str.size);
  upb_Status_SetErrorFormat
            (status,
             "Empty string is not a valid number (field: %s). This will be an error in a future version."
             ,pcVar1);
  return;
}

Assistant:

static void jsondec_checkempty(jsondec* d, upb_StringView str,
                               const upb_FieldDef* f) {
  if (str.size != 0) return;
  d->result = kUpb_JsonDecodeResult_Error;
  upb_Status_SetErrorFormat(d->status,
                            "Empty string is not a valid number (field: %s). "
                            "This will be an error in a future version.",
                            upb_FieldDef_FullName(f));
}